

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O0

bool __thiscall
adiak::value<std::array<float,3ul>>
          (adiak *this,string *name,array<float,_3UL> value,int category,string *subcategory)

{
  bool bVar1;
  int iVar2;
  adiak_datatype_t *dtype;
  adiak_value_t *value_00;
  char *name_00;
  char *subcategory_00;
  bool result;
  adiak_value_t *avalue;
  adiak_datatype_t *datatype;
  string *subcategory_local;
  int category_local;
  string *name_local;
  undefined1 local_18 [8];
  array<float,_3UL> value_local;
  
  value_local._M_elems[0] = value._M_elems[2];
  local_18 = value._M_elems._0_8_;
  dtype = internal::parse<std::array<float,_3UL>_>::make_type();
  if (dtype == (adiak_datatype_t *)0x0) {
    value_local._M_elems[1]._3_1_ = false;
  }
  else {
    value_00 = (adiak_value_t *)malloc(8);
    bVar1 = internal::parse<std::array<float,_3UL>_>::make_value
                      ((array<float,_3UL> *)local_18,value_00,dtype);
    if (bVar1) {
      name_00 = (char *)std::__cxx11::string::c_str();
      subcategory_00 = (char *)std::__cxx11::string::c_str();
      iVar2 = adiak_raw_namevalue(name_00,(int)name,subcategory_00,value_00,dtype);
      value_local._M_elems[1]._3_1_ = iVar2 == 0;
    }
    else {
      value_local._M_elems[1]._3_1_ = false;
    }
  }
  return value_local._M_elems[1]._3_1_;
}

Assistant:

bool value(std::string name, T value, int category = adiak_general, std::string subcategory = "") {
      adiak_datatype_t *datatype = adiak::internal::parse<T>::make_type();
      if (!datatype)
         return false;
      adiak_value_t *avalue = (adiak_value_t *) malloc(sizeof(adiak_value_t));
      bool result = adiak::internal::parse<T>::make_value(value, avalue, datatype);
      if (!result)
         return false;
      return adiak_raw_namevalue(name.c_str(), category, subcategory.c_str(), avalue, datatype) == 0;
   }